

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::InternalSwap
          (ResizeBilinearLayerParams *this,ResizeBilinearLayerParams *other)

{
  intptr_t iVar1;
  SamplingMode *pSVar2;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetsize_,&other->targetsize_);
  pSVar2 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = pSVar2;
  return;
}

Assistant:

void ResizeBilinearLayerParams::InternalSwap(ResizeBilinearLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  targetsize_.InternalSwap(&other->targetsize_);
  swap(mode_, other->mode_);
}